

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

ggml_backend_t whisper_backend_init_gpu(whisper_context_params *params)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  undefined8 uVar4;
  byte *in_RDI;
  ggml_backend_t result;
  ggml_backend_dev_t dev_cur;
  size_t i;
  int cnt;
  ggml_backend_dev_t dev;
  ulong local_28;
  int local_1c;
  long local_18;
  ggml_backend_t local_8;
  
  ggml_log_set(g_state.log_callback,g_state.log_callback_user_data);
  whisper_load_backends();
  local_18 = 0;
  local_1c = 0;
  if ((*in_RDI & 1) != 0) {
    for (local_28 = 0; uVar2 = ggml_backend_dev_count(), local_28 < uVar2; local_28 = local_28 + 1)
    {
      lVar3 = ggml_backend_dev_get(local_28);
      iVar1 = ggml_backend_dev_type(lVar3);
      if (iVar1 == 1) {
        if ((local_1c == 0) || (local_1c == *(int *)(in_RDI + 4))) {
          local_18 = lVar3;
        }
        local_1c = local_1c + 1;
        if (*(int *)(in_RDI + 4) < local_1c) break;
      }
    }
  }
  if (local_18 == 0) {
    whisper_log_internal(GGML_LOG_LEVEL_INFO,"%s: no GPU found\n","whisper_backend_init_gpu");
    local_8 = (ggml_backend_t)0x0;
  }
  else {
    uVar4 = ggml_backend_dev_name(local_18);
    whisper_log_internal
              (GGML_LOG_LEVEL_INFO,"%s: using %s backend\n","whisper_backend_init_gpu",uVar4);
    local_8 = (ggml_backend_t)ggml_backend_dev_init(local_18,0);
    if (local_8 == (ggml_backend_t)0x0) {
      uVar4 = ggml_backend_dev_name(local_18);
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,"%s: failed to initialize %s backend\n",
                 "whisper_backend_init_gpu",uVar4);
    }
  }
  return local_8;
}

Assistant:

static ggml_backend_t whisper_backend_init_gpu(const whisper_context_params & params) {
    ggml_log_set(g_state.log_callback, g_state.log_callback_user_data);

    whisper_load_backends();

    ggml_backend_dev_t dev = nullptr;

    int cnt = 0;
    if (params.use_gpu) {
        for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
            ggml_backend_dev_t dev_cur = ggml_backend_dev_get(i);
            if (ggml_backend_dev_type(dev_cur) == GGML_BACKEND_DEVICE_TYPE_GPU) {
                if (cnt == 0 || cnt == params.gpu_device) {
                    dev = dev_cur;
                }

                if (++cnt > params.gpu_device) {
                    break;
                }
            }
        }
    }

    if (dev == nullptr) {
        WHISPER_LOG_INFO("%s: no GPU found\n", __func__);
        return nullptr;
    }

    WHISPER_LOG_INFO("%s: using %s backend\n", __func__, ggml_backend_dev_name(dev));
    ggml_backend_t result = ggml_backend_dev_init(dev, nullptr);
    if (!result) {
        WHISPER_LOG_ERROR("%s: failed to initialize %s backend\n", __func__, ggml_backend_dev_name(dev));
    }

    return result;
}